

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessage
          (ParserImpl *this,Message *message,string *delimiter)

{
  string *__lhs;
  __type _Var1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Message *local_48;
  string *local_40;
  allocator local_32;
  allocator local_31;
  
  __lhs = &(this->tokenizer_).current_.text;
  local_48 = message;
  local_40 = delimiter;
  while( true ) {
    std::__cxx11::string::string((string *)&local_68,">",&local_32);
    _Var1 = std::operator==(__lhs,&local_68);
    if (_Var1) break;
    std::__cxx11::string::string((string *)&local_88,"}",&local_31);
    _Var1 = std::operator==(__lhs,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    if (_Var1) goto LAB_00317503;
    bVar2 = ConsumeField(this,local_48);
    if (!bVar2) {
      return false;
    }
  }
  std::__cxx11::string::~string((string *)&local_68);
LAB_00317503:
  bVar2 = Consume(this,local_40);
  return bVar2;
}

Assistant:

bool ConsumeMessage(Message* message, const std::string delimiter) {
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(ConsumeField(message));
    }

    // Confirm that we have a valid ending delimiter.
    DO(Consume(delimiter));
    return true;
  }